

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O2

void __thiscall tli_window_manager::Text::print(Text *this,Canvas *canvas,int row,int col)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  
  uVar5 = (ulong)this->index_;
  iVar2 = 0;
  iVar4 = 0;
  do {
    uVar7 = (this->buffer_)._M_string_length;
    iVar6 = this->cursor_position_;
    if (uVar7 <= uVar5) {
      iVar3 = (this->super_Box).height_;
LAB_00104b61:
      if ((uVar7 == (long)iVar6) && (iVar2 < iVar3)) {
        *(undefined1 *)
         (*(long *)&(canvas->
                    super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[iVar2 + row].
                    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
         + (long)(iVar4 + col)) = 0x7c;
      }
      return;
    }
    if ((int)uVar5 == iVar6) {
      *(undefined1 *)
       (*(long *)&(canvas->
                  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start[iVar2 + row].
                  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data +
       (long)(iVar4 + col)) = 0x7c;
      iVar4 = iVar4 + 1;
    }
    cVar1 = (this->buffer_)._M_dataplus._M_p[uVar5];
    if (cVar1 == '\n') {
      iVar2 = iVar2 + 1;
      iVar4 = 0;
      if (iVar2 == (this->super_Box).height_) {
        iVar6 = this->cursor_position_;
        uVar7 = (this->buffer_)._M_string_length;
        iVar4 = 0;
        iVar3 = iVar2;
        goto LAB_00104b61;
      }
    }
    else {
      *(char *)(*(long *)&(canvas->
                          super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[iVar2 + row].
                          super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data + (long)(iVar4 + col)) = cVar1;
      iVar4 = iVar4 + 1;
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

void Text::print(Canvas &canvas, int row, int col) const {
    int current_row = 0;
    int current_col = 0;
    for (int i = index_; i < buffer_.size(); ++i) {
        if (i == cursor_position_) {
            canvas[row + current_row][col + current_col] = '|';
            current_col++;
        }

        if (buffer_[i] == '\n') {
            current_row++;
            current_col = 0;
            if (current_row == height_) {
                break;
            }
        } else {
            canvas[row + current_row][col + current_col] = buffer_[i];
            current_col++;
        }
    }
    if (cursor_position_ == buffer_.size() && current_row < height_) {
        canvas[row + current_row][col + current_col] = '|';
    }
}